

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O1

bool __thiscall
MapLoader::validateCountryLine
          (MapLoader *this,int *countryCount,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lineWords,int *lineCount,bool *validMap,int *countryID,int *continentCount,bool verbose)

{
  char *__nptr;
  ulong uVar1;
  ostream *poVar2;
  uint *puVar3;
  long lVar4;
  undefined8 uVar5;
  uint uVar6;
  char *__nptr_00;
  char *local_38;
  
  *countryCount = *countryCount + 1;
  uVar1 = (long)(lineWords->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(lineWords->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar1 < 0x41) {
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Line ",5);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*lineCount);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,
                 " - [ERROR] : a line in the countries declaration had missing tokens, map could not be created.\n"
                 ,0x5f);
    }
    *validMap = false;
    return false;
  }
  if (verbose && uVar1 != 0x60) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Line ",5);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*lineCount);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," - [WARNING] : a line in  the countries declaration had extra tokens.\n",0x46
              );
  }
  __nptr_00 = (((lineWords->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  puVar3 = (uint *)__errno_location();
  uVar6 = *puVar3;
  *puVar3 = 0;
  lVar4 = strtol(__nptr_00,&local_38,10);
  if (local_38 == __nptr_00) {
    std::__throw_invalid_argument("stoi");
LAB_0011834d:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar4 != lVar4) || (*puVar3 == 0x22)) goto LAB_0011834d;
    if (*puVar3 == 0) {
      *puVar3 = uVar6;
    }
    if (*countryID != (int)lVar4) {
LAB_001182e0:
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Line ",5);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*lineCount);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2," - [ERROR] : a country or continent ID did was invalid.\n",0x38);
      }
      *validMap = false;
      return false;
    }
    __nptr = (lineWords->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
    uVar6 = *puVar3;
    __nptr_00 = (char *)(ulong)uVar6;
    *puVar3 = 0;
    lVar4 = strtol(__nptr,&local_38,10);
    if (local_38 != __nptr) {
      if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*puVar3 != 0x22)) {
        if (*puVar3 == 0) {
          *puVar3 = uVar6;
        }
        if ((int)lVar4 <= *continentCount) {
          *countryID = *countryID + 1;
          return true;
        }
        goto LAB_001182e0;
      }
      goto LAB_00118365;
    }
  }
  uVar6 = (uint)__nptr_00;
  std::__throw_invalid_argument("stoi");
LAB_00118365:
  uVar5 = std::__throw_out_of_range("stoi");
  if (*puVar3 == 0) {
    *puVar3 = uVar6;
  }
  _Unwind_Resume(uVar5);
}

Assistant:

bool MapLoader::validateCountryLine(int* countryCount, std::vector<std::string>* lineWords, const int* lineCount,
                               bool* validMap,
                               int* countryID, const int* continentCount,bool verbose) {
    (*countryCount)++;
    //check validity of the line in this mode
    if (lineWords->size() < 3) {
        if(verbose){
            std::cout << "Line " << *lineCount
                      << " - [ERROR] : a line in the countries declaration had missing tokens, map could not be created.\n";
        }
        *validMap = false;
        return false;
    } else {
        if (lineWords->size() > 3 && verbose)
            std::cout << "Line " << *lineCount
                      << " - [WARNING] : a line in  the countries declaration had extra tokens.\n";
        //check country id matches with order and that it references a valid continent
        if (std::stoi((*lineWords)[0]) == *countryID && std::stoi((*lineWords)[2]) <= *continentCount) {
            (*countryID)++;
            return true;
        } else {
            if(verbose){
                std::cout << "Line " << *lineCount << " - [ERROR] : a country or continent ID did was invalid.\n";
            }
            *validMap = false;
            return false;
        }
    }
}